

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPServer.cpp
# Opt level: O2

ssize_t __thiscall
SocketPP::TCPServer::send(TCPServer *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  __normal_iterator<const_SocketPP::TCPStream_*,_std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>_>
  this_00;
  size_t __n_00;
  undefined4 in_register_00000034;
  Message *__args;
  TCPStream *pTVar2;
  ssize_t sStack_30;
  
  __args = (Message *)CONCAT44(in_register_00000034,__fd);
  if ((this->super_SocketServer).super_Socket.field_0xc == '\0') {
    printf("\x1b[31mERROR: %s: %s: %d: not inited!\x1b[m\n","TCPServer.cpp","send",0x1b);
    sStack_30 = -2;
  }
  else {
    std::mutex::lock(&this->streamMutex_);
    __n_00 = (__args->rawMsg).len_;
    printf("\x1b[33m%s: TCPServer::send: target=%d, len=%ld\x1b[m\n","TCPServer.cpp",
           (ulong)(uint)(__args->target).fd);
    if (((this->sendInterceptor_).super__Function_base._M_manager == (_Manager_type)0x0) ||
       (bVar1 = std::function<bool_(const_SocketPP::Message_&)>::operator()
                          (&this->sendInterceptor_,__args), !bVar1)) {
      pTVar2 = (this->connectedStreams_).
               super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>._M_impl
               .super__Vector_impl_data._M_finish;
      this_00 = std::
                __find_if<__gnu_cxx::__normal_iterator<SocketPP::TCPStream_const*,std::vector<SocketPP::TCPStream,std::allocator<SocketPP::TCPStream>>>,__gnu_cxx::__ops::_Iter_equals_val<SocketPP::TCPStream_const>>
                          ((this->connectedStreams_).
                           super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>
                           ._M_impl.super__Vector_impl_data._M_start,pTVar2,__args);
      if (this_00._M_current ==
          (this->connectedStreams_).
          super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        printf("\x1b[31mERROR: %s: %s: %d: StreamNotFound\x1b[m\n","TCPServer.cpp","send",0x28);
        sStack_30 = -3;
      }
      else {
        onSend(this,pTVar2,__args);
        printf("\x1b[33m%s: try to send to stream:%d\x1b[m\n","TCPServer.cpp",
               (ulong)(uint)(this_00._M_current)->fd);
        sStack_30 = TCPStream::send(this_00._M_current,(int)(__args->rawMsg).data_,
                                    (void *)(__args->rawMsg).len_,__n_00,__flags);
        if (sStack_30 == -1) {
          printf("\x1b[31mERROR: %s: %s: %d: send failed!\x1b[m\n","TCPServer.cpp","send",0x34);
          sStack_30 = -1;
        }
        else {
          printf("\x1b[33m%s: send success! len:%ld\x1b[m\n","TCPServer.cpp",sStack_30);
        }
      }
    }
    else {
      sStack_30 = 0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->streamMutex_);
  }
  return sStack_30;
}

Assistant:

ssize_t TCPServer::send(const Message& message) {
    if (!started_) {
        LOGE("not inited!");
        return SendResult::SocketNotInited;
    }

    std::lock_guard<std::mutex> lockStream(streamMutex_);
    LOGD("TCPServer::send: target=%d, len=%ld", message.target.fd, message.rawMsg.length());

    if (sendInterceptor_) {
        if (sendInterceptor_(message)) return SendResult::Intercepted;
    }

    const auto& iter = std::find(connectedStreams_.cbegin(), connectedStreams_.cend(), message.target);
    if (iter == connectedStreams_.cend()) {
        LOGE("StreamNotFound");
        return StreamNotFound;
    }

    const auto& stream = *iter;
    onSend(stream, message);

    LOGD("try to send to stream:%d", stream.fd);
    const auto& rawMsg = message.rawMsg;
    ssize_t ret = stream.send(rawMsg.data(), rawMsg.length());

    if (ret == -1) {
        LOGE("send failed!");
    } else {
        LOGD("send success! len:%ld", ret);
    }

    return ret;
}